

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  SampledSpectrum SVar7;
  RGB local_58;
  float local_48;
  undefined4 uStack_44;
  Float local_40;
  RGBIlluminantSpectrum local_38;
  RGB local_20;
  undefined1 auVar4 [16];
  
  iVar3 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,&local_48);
  if (iVar3 == 1) {
    SVar7.values.values[2] = local_48;
    SVar7.values.values[3] = local_48;
    SVar7.values.values[0] = local_48;
    SVar7.values.values[1] = local_48;
  }
  else {
    auVar4._4_4_ = uStack_44;
    auVar4._0_4_ = local_48;
    auVar4._8_8_ = 0;
    local_58.b = local_40;
    if (this->spectrumType == Albedo) {
      uVar1 = vcmpps_avx512vl(auVar4,ZEXT816(0) << 0x40,5);
      auVar6._8_4_ = 0x3f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar6._12_4_ = 0x3f800000;
      auVar4 = vminps_avx512vl(auVar6,auVar4);
      auVar5._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar4._4_4_;
      auVar5._0_4_ = (uint)((byte)uVar1 & 1) * auVar4._0_4_;
      auVar5._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar4._8_4_;
      auVar5._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar4._12_4_;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)local_40),ZEXT816(0) << 0x40,1);
      local_20._0_8_ = vmovlps_avx(auVar5);
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_40));
      local_20.b = (Float)((uint)!(bool)((byte)uVar2 & 1) * auVar4._0_4_);
      RGBAlbedoSpectrum::RGBAlbedoSpectrum
                ((RGBAlbedoSpectrum *)&local_38,RGBColorSpace::sRGB,&local_20);
      SVar7 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_38,&lambda);
    }
    else if (this->spectrumType == Unbounded) {
      RGBUnboundedSpectrum::RGBUnboundedSpectrum
                ((RGBUnboundedSpectrum *)&local_38,RGBColorSpace::sRGB,&local_58);
      SVar7 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_38,&lambda);
    }
    else {
      RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_38,RGBColorSpace::sRGB,&local_58);
      SVar7 = RGBIlluminantSpectrum::Sample(&local_38,&lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar7;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    RGB rgb(result[0], result[1], result[2]);
    if (spectrumType == SpectrumType::Unbounded)
        return RGBUnboundedSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
    else if (spectrumType == SpectrumType::Albedo)
        return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, Clamp(rgb, 0, 1)).Sample(lambda);
    else
        return RGBIlluminantSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}